

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fdb_anomaly_test.cc
# Opt level: O1

void * bad_thread(void *voidargs)

{
  fdb_kvs_handle *iterator;
  fdb_status fVar1;
  void *pvVar2;
  undefined8 uVar3;
  undefined4 extraout_EDX;
  undefined1 *puVar4;
  fdb_doc *pfVar5;
  fdb_doc *pfVar6;
  fdb_doc *pfVar7;
  fdb_doc *pfVar8;
  fdb_doc *pfVar9;
  fdb_doc *pfVar10;
  fdb_doc *pfVar11;
  fdb_kvs_handle *pfVar12;
  fdb_kvs_handle *handle;
  undefined8 in_R8;
  undefined8 in_R9;
  fdb_doc doc;
  timeval __test_begin;
  fdb_doc local_78;
  timeval local_20;
  
  pfVar5 = &local_78;
  pfVar6 = &local_78;
  pfVar9 = &local_78;
  pfVar7 = &local_78;
  pfVar10 = &local_78;
  pfVar8 = &local_78;
  pfVar11 = &local_78;
  handle = *(fdb_kvs_handle **)((long)voidargs + 8);
  iterator = *(fdb_kvs_handle **)((long)voidargs + 0x10);
  puVar4 = (undefined1 *)0x0;
  gettimeofday(&local_20,(__timezone_ptr_t)0x0);
  local_78.seqnum = 0;
  local_78.metalen = 0;
  local_78.deleted = false;
  local_78._73_3_ = 0;
  local_78.flags = 0;
  local_78.size_ondisk = 0;
  local_78.offset = 0;
  local_78.meta = (void *)0x0;
  uVar3 = 2;
  local_78.keylen = 2;
  local_78.bodylen = 2;
  local_78.key = &local_78;
  local_78.body = &local_78;
  if (iterator == (fdb_kvs_handle *)0x0) {
LAB_0010767a:
    pfVar12 = handle;
    fVar1 = fdb_set(handle,&local_78);
    puVar4 = (undefined1 *)pfVar5;
    if (fVar1 != FDB_RESULT_HANDLE_BUSY) goto LAB_00107714;
    pfVar12 = handle;
    fVar1 = fdb_del(handle,&local_78);
    if (fVar1 != FDB_RESULT_HANDLE_BUSY) goto LAB_00107719;
    pfVar12 = handle;
    fVar1 = fdb_get(handle,&local_78);
    if (fVar1 != FDB_RESULT_HANDLE_BUSY) goto LAB_0010771e;
    pfVar12 = handle;
    fVar1 = fdb_get_metaonly(handle,&local_78);
    if (fVar1 != FDB_RESULT_HANDLE_BUSY) goto LAB_00107723;
    pfVar12 = handle;
    fVar1 = fdb_get_byseq(handle,&local_78);
    if (fVar1 != FDB_RESULT_HANDLE_BUSY) goto LAB_00107728;
    pfVar12 = handle;
    fVar1 = fdb_get_metaonly_byseq(handle,&local_78);
    if (fVar1 == FDB_RESULT_HANDLE_BUSY) {
      local_78.offset = 5000;
      fVar1 = fdb_get_byoffset(handle,&local_78);
      if (fVar1 == FDB_RESULT_HANDLE_BUSY) {
        return (void *)0x0;
      }
      goto LAB_00107732;
    }
  }
  else {
    pfVar12 = iterator;
    local_78.key = &local_78;
    local_78.body = &local_78;
    fVar1 = fdb_iterator_next((fdb_iterator *)iterator);
    if (fVar1 == FDB_RESULT_HANDLE_BUSY) {
      pfVar12 = iterator;
      fVar1 = fdb_iterator_prev((fdb_iterator *)iterator);
      if (fVar1 != FDB_RESULT_HANDLE_BUSY) goto LAB_00107705;
      pfVar12 = iterator;
      fVar1 = fdb_iterator_seek_to_min((fdb_iterator *)iterator);
      if (fVar1 != FDB_RESULT_HANDLE_BUSY) goto LAB_0010770a;
      pfVar12 = iterator;
      fVar1 = fdb_iterator_seek_to_max((fdb_iterator *)iterator);
      if (fVar1 == FDB_RESULT_HANDLE_BUSY) {
        uVar3 = 0;
        fVar1 = fdb_iterator_seek((fdb_iterator *)iterator,local_78.key,local_78.keylen,'\0');
        if (fVar1 == FDB_RESULT_HANDLE_BUSY) {
          return (void *)0x0;
        }
        bad_thread();
        goto LAB_0010767a;
      }
    }
    else {
      bad_thread();
LAB_00107705:
      bad_thread();
LAB_0010770a:
      bad_thread();
    }
    bad_thread();
LAB_00107714:
    bad_thread();
    pfVar6 = (fdb_doc *)puVar4;
LAB_00107719:
    pfVar9 = pfVar6;
    bad_thread();
LAB_0010771e:
    bad_thread();
    pfVar7 = pfVar9;
LAB_00107723:
    pfVar10 = pfVar7;
    bad_thread();
LAB_00107728:
    bad_thread();
    pfVar8 = pfVar10;
  }
  handle = pfVar12;
  pfVar11 = pfVar8;
  bad_thread();
LAB_00107732:
  bad_thread();
  if (*(char *)&handle->kvs == '\x01') {
    bad_thread(handle);
  }
  pvVar2 = (void *)(**(code **)((long)pfVar11 + 8))(extraout_EDX,uVar3,in_R8,in_R9);
  return pvVar2;
}

Assistant:

void *bad_thread(void *voidargs) {
    struct shared_data *data = (struct shared_data *)voidargs;
    fdb_kvs_handle *db = data->db;
    fdb_iterator *itr = data->iterator;
    fdb_status s;
    fdb_doc doc;
    TEST_INIT();

    memset(&doc, 0, sizeof(fdb_doc));
    doc.key = &doc; // some non-null value
    doc.keylen = 2; // some non-zero value
    doc.body = &doc; // some non-null value
    doc.bodylen = 2; // some non-zero value

    if (!itr) {
        // since the parent thread is hung in the fdb_set callback
        // all the forestdb apis calls on the same handle must return failure
        s = fdb_set(db, &doc);
        TEST_CHK(s == FDB_RESULT_HANDLE_BUSY);
        s = fdb_del(db, &doc);
        TEST_CHK(s == FDB_RESULT_HANDLE_BUSY);
        s = fdb_get(db, &doc);
        TEST_CHK(s == FDB_RESULT_HANDLE_BUSY);
        s = fdb_get_metaonly(db, &doc);
        TEST_CHK(s == FDB_RESULT_HANDLE_BUSY);
        s = fdb_get_byseq(db, &doc);
        TEST_CHK(s == FDB_RESULT_HANDLE_BUSY);
        s = fdb_get_metaonly_byseq(db, &doc);
        TEST_CHK(s == FDB_RESULT_HANDLE_BUSY);
        doc.offset = 5000; // some random non-zero value
        s = fdb_get_byoffset(db, &doc);
        TEST_CHK(s == FDB_RESULT_HANDLE_BUSY);
    } else {
        s = fdb_iterator_next(itr);
        TEST_CHK(s == FDB_RESULT_HANDLE_BUSY);
        s = fdb_iterator_prev(itr);
        TEST_CHK(s == FDB_RESULT_HANDLE_BUSY);
        s = fdb_iterator_seek_to_min(itr);
        TEST_CHK(s == FDB_RESULT_HANDLE_BUSY);
        s = fdb_iterator_seek_to_max(itr);
        TEST_CHK(s == FDB_RESULT_HANDLE_BUSY);
        s = fdb_iterator_seek(itr, doc.key, doc.keylen, 0);
        TEST_CHK(s == FDB_RESULT_HANDLE_BUSY);
    }

    return NULL;
}